

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O3

void __thiscall Assimp::B3DImporter::ReadVRTS(B3DImporter *this)

{
  pointer pVVar1;
  ulong uVar2;
  pointer pVVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  B3DImporter *this_00;
  long lVar8;
  ulong uVar9;
  float fVar10;
  float local_88 [8];
  float local_68;
  ulong local_58;
  undefined1 local_50 [32];
  
  iVar4 = ReadInt(this);
  this->_vflags = iVar4;
  iVar4 = ReadInt(this);
  this->_tcsets = iVar4;
  uVar5 = ReadInt(this);
  this->_tcsize = uVar5;
  if ((uVar5 < 5) && ((uint)this->_tcsets < 5)) {
    uVar7 = this->_vflags & 2;
    iVar4 = uVar5 * this->_tcsets * 4;
    uVar5 = iVar4 + 0x18 + uVar7 * 8;
    if ((this->_vflags & 1U) == 0) {
      uVar5 = iVar4 + 0xc + uVar7 * 8;
    }
    uVar7 = (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish[-1] - this->_pos;
    uVar2 = (ulong)uVar7 / (ulong)uVar5;
    iVar4 = (int)((long)(this->_vertices).
                        super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->_vertices).
                        super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x49249249;
    std::vector<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>::resize
              (&this->_vertices,(long)(iVar4 + (int)uVar2));
    if (uVar5 <= uVar7) {
      uVar9 = 0;
      local_58 = uVar2;
      do {
        pVVar1 = (this->_vertices).
                 super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pVVar3 = pVVar1 + uVar9 + (long)iVar4;
        pVVar3->bones[0] = '\0';
        pVVar3->bones[1] = '\0';
        pVVar3->bones[2] = '\0';
        pVVar3->bones[3] = '\0';
        pVVar3->weights[0] = 0.0;
        *(float *)((long)(pVVar3->bones + 8) + 0) = 0.0;
        *(float *)((long)(pVVar3->bones + 8) + 4) = 0.0;
        pVVar1[uVar9 + (long)iVar4].weights[3] = 0.0;
        local_68 = ReadFloat(this);
        local_88[4] = ReadFloat(this);
        fVar10 = ReadFloat(this);
        pVVar1[uVar9 + (long)iVar4].vertex.x = local_68;
        pVVar1[uVar9 + (long)iVar4].vertex.y = local_88[4];
        pVVar1[uVar9 + (long)iVar4].vertex.z = fVar10;
        uVar5 = this->_vflags;
        if ((uVar5 & 1) != 0) {
          local_68 = ReadFloat(this);
          local_88[4] = ReadFloat(this);
          fVar10 = ReadFloat(this);
          pVVar1[uVar9 + (long)iVar4].normal.x = local_68;
          pVVar1[uVar9 + (long)iVar4].normal.y = local_88[4];
          pVVar1[uVar9 + (long)iVar4].normal.z = fVar10;
          uVar5 = this->_vflags;
        }
        if ((uVar5 & 2) != 0) {
          ReadQuat(this);
        }
        if (0 < this->_tcsets) {
          iVar6 = 0;
          do {
            local_88[0] = 0.0;
            local_88[1] = 0.0;
            local_88[2] = 0.0;
            local_88[3] = 0.0;
            if (this->_tcsize < 1) {
              fVar10 = 0.0;
            }
            else {
              lVar8 = 0;
              do {
                fVar10 = ReadFloat(this);
                local_88[lVar8] = fVar10;
                lVar8 = lVar8 + 1;
              } while (lVar8 < this->_tcsize);
              fVar10 = local_88[1];
            }
            if (iVar6 == 0) {
              pVVar1[uVar9 + (long)iVar4].texcoords.x = local_88[0];
              pVVar1[uVar9 + (long)iVar4].texcoords.y = 1.0 - fVar10;
              pVVar1[uVar9 + (long)iVar4].texcoords.z = local_88[2];
            }
            iVar6 = iVar6 + 1;
          } while (iVar6 < this->_tcsets);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != local_58);
    }
    return;
  }
  local_50._0_8_ = local_50 + 0x10;
  this_00 = (B3DImporter *)local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Bad texcoord data","");
  Fail(this_00,(string *)local_50);
}

Assistant:

void B3DImporter::ReadVRTS(){
    _vflags=ReadInt();
    _tcsets=ReadInt();
    _tcsize=ReadInt();
    if( _tcsets<0 || _tcsets>4 || _tcsize<0 || _tcsize>4 ){
        Fail( "Bad texcoord data" );
    }

    int sz=12+(_vflags&1?12:0)+(_vflags&2?16:0)+(_tcsets*_tcsize*4);
    int n_verts=ChunkSize()/sz;

    int v0=static_cast<int>(_vertices.size());
    _vertices.resize( v0+n_verts );

    for( int i=0;i<n_verts;++i ){
        Vertex &v=_vertices[v0+i];

        memset( v.bones,0,sizeof(v.bones) );
        memset( v.weights,0,sizeof(v.weights) );

        v.vertex=ReadVec3();

        if( _vflags & 1 ) v.normal=ReadVec3();

        if( _vflags & 2 ) ReadQuat();	//skip v 4bytes...

        for( int i=0;i<_tcsets;++i ){
            float t[4]={0,0,0,0};
            for( int j=0;j<_tcsize;++j ){
                t[j]=ReadFloat();
            }
            t[1]=1-t[1];
            if( !i ) v.texcoords=aiVector3D( t[0],t[1],t[2] );
        }
    }
}